

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

string * __thiscall
cmCTestCoverageHandler::FindFile
          (string *__return_storage_ptr__,cmCTestCoverageHandler *this,
          cmCTestCoverageHandlerContainer *cont,string *fileName)

{
  bool bVar1;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined4 local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string fullName;
  string fileNameNoE;
  string *fileName_local;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  cmsys::SystemTools::GetFilenameWithoutLastExtension
            ((string *)((long)&fullName.field_2 + 8),fileName);
  std::operator+(&local_a8,&cont->SourceDir,"/");
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fullName.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,".py");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_68);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_68);
  }
  else {
    std::operator+(&local_118,&cont->BinaryDir,"/");
    std::operator+(&local_f8,&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&fullName.field_2 + 8));
    std::operator+(&local_d8,&local_f8,".py");
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_68);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_68);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_119);
      std::allocator<char>::~allocator(&local_119);
    }
  }
  local_b8 = 1;
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(fullName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestCoverageHandler::FindFile(
  cmCTestCoverageHandlerContainer* cont, std::string const& fileName)
{
  std::string fileNameNoE =
    cmSystemTools::GetFilenameWithoutLastExtension(fileName);
  // First check in source and binary directory
  std::string fullName = cont->SourceDir + "/" + fileNameNoE + ".py";
  if (cmSystemTools::FileExists(fullName)) {
    return fullName;
  }
  fullName = cont->BinaryDir + "/" + fileNameNoE + ".py";
  if (cmSystemTools::FileExists(fullName)) {
    return fullName;
  }
  return "";
}